

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O2

void __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquation
          (BlendMaskStateMachine *this,GLenum mode)

{
  pointer pBVar1;
  pointer pBVar2;
  uint uVar3;
  ulong uVar4;
  
  (*this->gl->blendEquation)(mode);
  pBVar1 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar2 = (this->state).
           super__Vector_base<glcts::DrawBuffersIndexedBase::BlendMaskState,_std::allocator<glcts::DrawBuffersIndexedBase::BlendMaskState>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (ulong)((long)pBVar2 - (long)pBVar1 >> 5);
      uVar3 = uVar3 + 1) {
    pBVar1[uVar4].mode_rgb = mode;
    pBVar1[uVar4].mode_a = mode;
  }
  return;
}

Assistant:

void DrawBuffersIndexedBase::BlendMaskStateMachine::SetBlendEquation(glw::GLenum mode)
{
	// all draw buffers
	gl.blendEquation(mode);
	for (unsigned int i = 0; i < state.size(); ++i)
	{
		state[i].mode_rgb = mode;
		state[i].mode_a   = mode;
	}
}